

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyUtil.cpp
# Opt level: O0

void tcu::writeTxtCaselistsToFiles(TestPackageRoot *root,TestContext *testCtx,CommandLine *cmdLine)

{
  PtrData<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> data;
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  State SVar4;
  TestNodeType TVar5;
  CommandLine *this;
  Archive *archive;
  CaseListFilter *caseListFilter_00;
  char *__s;
  TestNode *pTVar6;
  char *pcVar7;
  Exception *this_00;
  undefined8 uVar8;
  ostream *poVar9;
  string *psVar10;
  CaseListFilter *in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  ostream local_368 [8];
  ofstream out;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  string filename;
  char *pkgName;
  TestNode *node;
  char *filenamePattern;
  TestHierarchyIterator iter;
  PtrData<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> local_60;
  PtrData<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> *local_50;
  undefined1 local_40 [8];
  MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> caseListFilter;
  DefaultHierarchyInflater inflater;
  CommandLine *cmdLine_local;
  TestContext *testCtx_local;
  TestPackageRoot *root_local;
  
  DefaultHierarchyInflater::DefaultHierarchyInflater
            ((DefaultHierarchyInflater *)
             &caseListFilter.
              super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
              .m_data.field_0x8,testCtx);
  this = TestContext::getCommandLine(testCtx);
  archive = TestContext::getArchive(testCtx);
  CommandLine::createCaseListFilter
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)&local_60,
             this,archive);
  local_50 = de::details::MovePtr::operator_cast_to_PtrData(&local_60,(MovePtr *)this);
  data._8_8_ = in_stack_fffffffffffffbb0;
  data.ptr = in_stack_fffffffffffffba8;
  de::details::MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::
  MovePtr((MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> *)
          local_40,data);
  de::details::MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::~MovePtr
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)&local_60);
  caseListFilter_00 =
       de::details::
       UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::
       operator*((UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
                  *)local_40);
  TestHierarchyIterator::TestHierarchyIterator
            ((TestHierarchyIterator *)&filenamePattern,root,
             (TestHierarchyInflater *)
             &caseListFilter.
              super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
              .m_data.field_0x8,caseListFilter_00);
  __s = CommandLine::getCaseListExportFile(cmdLine);
  while( true ) {
    SVar4 = TestHierarchyIterator::getState((TestHierarchyIterator *)&filenamePattern);
    if (SVar4 == STATE_FINISHED) {
      TestHierarchyIterator::~TestHierarchyIterator((TestHierarchyIterator *)&filenamePattern);
      de::details::
      MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::~MovePtr
                ((MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
                  *)local_40);
      DefaultHierarchyInflater::~DefaultHierarchyInflater
                ((DefaultHierarchyInflater *)
                 &caseListFilter.
                  super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
                  .m_data.field_0x8);
      return;
    }
    pTVar6 = TestHierarchyIterator::getNode((TestHierarchyIterator *)&filenamePattern);
    filename.field_2._8_8_ = TestNode::getName(pTVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,__s,&local_111);
    uVar1 = filename.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,(char *)uVar1,&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"txt",&local_161);
    makePackageFilename((string *)local_f0,&local_110,&local_138,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_368,pcVar7,_S_bin);
    bVar2 = std::ofstream::is_open();
    if (((bVar2 & 1) == 0) ||
       (bVar2 = std::ios::good(), uVar1 = filename.field_2._8_8_, (bVar2 & 1) == 0)) break;
    uVar8 = std::__cxx11::string::c_str();
    print("Writing test cases from \'%s\' to file \'%s\'..\n",uVar1,uVar8);
    TestHierarchyIterator::next((TestHierarchyIterator *)&filenamePattern);
    while( true ) {
      pTVar6 = TestHierarchyIterator::getNode((TestHierarchyIterator *)&filenamePattern);
      TVar5 = TestNode::getNodeType(pTVar6);
      if (TVar5 == NODETYPE_PACKAGE) break;
      SVar4 = TestHierarchyIterator::getState((TestHierarchyIterator *)&filenamePattern);
      if (SVar4 == STATE_ENTER_NODE) {
        pTVar6 = TestHierarchyIterator::getNode((TestHierarchyIterator *)&filenamePattern);
        TVar5 = TestNode::getNodeType(pTVar6);
        bVar3 = isTestNodeTypeExecutable(TVar5);
        pcVar7 = "GROUP";
        if (bVar3) {
          pcVar7 = "TEST";
        }
        poVar9 = std::operator<<(local_368,pcVar7);
        poVar9 = std::operator<<(poVar9,": ");
        psVar10 = TestHierarchyIterator::getNodePath_abi_cxx11_
                            ((TestHierarchyIterator *)&filenamePattern);
        poVar9 = std::operator<<(poVar9,(string *)psVar10);
        std::operator<<(poVar9,"\n");
      }
      TestHierarchyIterator::next((TestHierarchyIterator *)&filenamePattern);
    }
    TestHierarchyIterator::next((TestHierarchyIterator *)&filenamePattern);
    std::ofstream::~ofstream(local_368);
    std::__cxx11::string::~string((string *)local_f0);
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  std::operator+(&local_388,"Failed to open ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  Exception::Exception(this_00,&local_388);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void writeTxtCaselistsToFiles (TestPackageRoot& root, TestContext& testCtx, const CommandLine& cmdLine)
{
	DefaultHierarchyInflater			inflater		(testCtx);
	de::MovePtr<const CaseListFilter>	caseListFilter	(testCtx.getCommandLine().createCaseListFilter(testCtx.getArchive()));

	TestHierarchyIterator				iter			(root, inflater, *caseListFilter);
	const char* const					filenamePattern = cmdLine.getCaseListExportFile();

	while (iter.getState() != TestHierarchyIterator::STATE_FINISHED)
	{
		const TestNode* node		= iter.getNode();
		const char*		pkgName		= node->getName();
		const string	filename	= makePackageFilename(filenamePattern, pkgName, "txt");

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE &&
				  node->getNodeType() == NODETYPE_PACKAGE);

		std::ofstream out(filename.c_str(), std::ios_base::binary);
		if (!out.is_open() || !out.good())
			throw Exception("Failed to open " + filename);

		print("Writing test cases from '%s' to file '%s'..\n", pkgName, filename.c_str());

		iter.next();

		while (iter.getNode()->getNodeType() != NODETYPE_PACKAGE)
		{
			if (iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE)
				out << (isTestNodeTypeExecutable(iter.getNode()->getNodeType()) ? "TEST" : "GROUP") << ": " << iter.getNodePath() << "\n";
			iter.next();
		}

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_LEAVE_NODE &&
				  iter.getNode()->getNodeType() == NODETYPE_PACKAGE);
		iter.next();
	}
}